

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall
QNetworkReplyImplPrivate::setDownloadBuffer
          (QNetworkReplyImplPrivate *this,QSharedPointer<char> sp,qint64 size)

{
  QNetworkReply *this_00;
  char *pcVar1;
  Data *pDVar2;
  Data *dd;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  pcVar1 = *sp.value.ptr.ptr;
  pDVar2 = *(Data **)(sp.value.ptr.ptr + 8);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  dd = (this->downloadBufferPointer).d;
  (this->downloadBufferPointer).d = pDVar2;
  (this->downloadBufferPointer).value.ptr = pcVar1;
  QSharedPointer<char>::deref(dd);
  this->downloadBuffer = (this->downloadBufferPointer).value.ptr;
  this->downloadBufferCurrentSize = 0;
  this->downloadBufferMaximumSize = (qint64)sp.d;
  QVariant::QVariant(&QStack_48,(QMetaType)0x2da938,&this->downloadBufferPointer);
  QNetworkReply::setAttribute(this_00,DownloadBufferAttribute,&QStack_48);
  QVariant::~QVariant(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::setDownloadBuffer(QSharedPointer<char> sp, qint64 size)
{
    Q_Q(QNetworkReplyImpl);

    downloadBufferPointer = sp;
    downloadBuffer = downloadBufferPointer.data();
    downloadBufferCurrentSize = 0;
    downloadBufferMaximumSize = size;
    q->setAttribute(QNetworkRequest::DownloadBufferAttribute, QVariant::fromValue<QSharedPointer<char> > (downloadBufferPointer));
}